

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void __thiscall
google::protobuf::Reflection::VerifyFieldType<bool>(Reflection *this,FieldDescriptor *field)

{
  int v1;
  CppType t;
  int v2;
  bool *v1_00;
  integral_constant<bool,_false> *v2_00;
  char *pcVar1;
  LogMessage *pLVar2;
  string local_b0;
  LogMessage local_90;
  Voidify local_79;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  CppType cpp_type;
  string local_60;
  LogMessage local_40;
  Voidify local_2a;
  bool local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  anon_class_8_1_a7e8901a error;
  FieldDescriptor *field_local;
  Reflection *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)&error;
  error.field = (FieldDescriptor **)field;
  local_29 = FieldDescriptor::is_repeated(field);
  v1_00 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_29);
  v2_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<std::integral_constant<bool,false>>
                    ((integral_constant<bool,_false> *)&internal::IsRepeatedT<bool>);
  local_28 = absl::lts_20250127::log_internal::Check_EQImpl<bool,std::integral_constant<bool,false>>
                       (v1_00,v2_00,"field->is_repeated() == internal::IsRepeatedT<T>");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6b3,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    const::{lambda()#1}::operator()[abi_cxx11_(&local_60,&absl_log_internal_check_op_result);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,&local_60);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_2a,pLVar2);
    std::__cxx11::string::~string((string *)&local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  absl_log_internal_check_op_result_1._0_4_ =
       FieldDescriptor::cpp_type((FieldDescriptor *)error.field);
  if ((CppType)absl_log_internal_check_op_result_1 == CPPTYPE_ENUM) {
    absl_log_internal_check_op_result_1._0_4_ = CPPTYPE_INT32;
  }
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                 ((CppType)absl_log_internal_check_op_result_1);
  t = internal::GetCppType<bool>();
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  local_78 = absl::lts_20250127::log_internal::Check_EQImpl
                       (v1,v2,"+cpp_type == +internal::GetCppType<T>()");
  if (local_78 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_78);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6bf,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
    const::{lambda()#1}::operator()[abi_cxx11_(&local_b0,&absl_log_internal_check_op_result);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,&local_b0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
    std::__cxx11::string::~string((string *)&local_b0);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_90);
  }
  return;
}

Assistant:

void Reflection::VerifyFieldType(const FieldDescriptor* field) const {
  if constexpr (!internal::PerformDebugChecks()) {
    return;
  }
  if constexpr (std::is_const_v<T>) {
    return VerifyFieldType<std::remove_const_t<T>>(field);
  }

  // `char` and `void` are used in places where we don't know the type yet.
  if constexpr (std::is_same_v<T, char> || std::is_same_v<T, void>) {
    return;
  }

  const auto error = [&] {
    return absl::StrFormat("Invalid cast of %s to type %s.", field->full_name(),
                           internal::RttiTypeName<T>().value_or("unknown"));
  };

  ABSL_DCHECK_EQ(field->is_repeated(), internal::IsRepeatedT<T>) << error();
  if constexpr (std::is_same_v<T, internal::MapFieldBase>) {
    ABSL_DCHECK(field->is_map()) << error();
  } else if constexpr (std::is_same_v<T, internal::RepeatedPtrFieldBase>) {
    // It has to be string or message.
    ABSL_DCHECK(field->cpp_type() == field->CPPTYPE_STRING ||
                field->cpp_type() == field->CPPTYPE_MESSAGE)
        << error();
  } else {
    auto cpp_type = field->cpp_type();
    // Collapse ENUM to INT32 because they are the same through reflection.
    if (cpp_type == field->CPPTYPE_ENUM) cpp_type = field->CPPTYPE_INT32;
    ABSL_DCHECK_EQ(+cpp_type, +internal::GetCppType<T>()) << error();

    // Check subfield types for message.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_MESSAGE) {
      // Singular/oneof messages are by pointer, except non-oneof Lazy.
      if (!field->is_repeated() &&
          (!IsLazyField(field) || field->real_containing_oneof() != nullptr)) {
        ABSL_DCHECK(std::is_pointer_v<T>) << error();
      }
    }

    // Check subfield types for string.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          if (IsMicroString(field)) {
            ABSL_DCHECK((std::is_same_v<T, internal::MicroString>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, internal::ArenaStringPtr> ||
                         std::is_same_v<T, RepeatedPtrField<std::string>>))
                << error();
          }
          break;
        case FieldDescriptor::CppStringType::kCord:
          if (field->real_containing_oneof() != nullptr) {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord*>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord> ||
                         std::is_same_v<T, RepeatedField<absl::Cord>>))
                << error();
          }
          break;
      }
    }
  }
}